

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fdct8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  uint uVar11;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i x4 [8];
  __m256i x3 [8];
  __m256i x2 [8];
  __m256i x1 [8];
  __m256i cospi_m40_p24;
  __m256i cospi_p24_p40;
  __m256i cospi_m08_p56;
  __m256i cospi_p56_p08;
  __m256i cospi_m16_p48;
  __m256i cospi_p48_p16;
  __m256i cospi_p32_m32;
  __m256i cospi_p32_p32;
  __m256i cospi_m32_p32;
  __m256i __rounding;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff610;
  __m256i *in0;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined4 uStack_830;
  int32_t in_stack_fffffffffffff7d4;
  int32_t cos_bit_00;
  undefined8 in_stack_fffffffffffff7d8;
  undefined8 uVar12;
  undefined8 in_stack_fffffffffffff7e0;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffff7e8;
  undefined8 uVar14;
  longlong in_stack_fffffffffffff7f0;
  longlong lVar15;
  undefined8 uStack_808;
  undefined8 local_800;
  __m256i *in1;
  __m256i *in1_00;
  __m256i *in0_00;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  longlong lVar22;
  longlong lVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  longlong lVar30;
  longlong lVar31;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  
  cospi_arr((int)in_DL);
  uVar11 = 1 << (in_DL - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  vpinsrd_avx(auVar1,uVar11,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  vpinsrd_avx(auVar1,uVar11,3);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff610 >> 0x10),
                     (int16_t)in_stack_fffffffffffff610);
  auVar2 = vpaddsw_avx2(*in_RDI,in_RDI[7]);
  auVar7 = vpsubsw_avx2(*in_RDI,in_RDI[7]);
  auVar3 = vpaddsw_avx2(in_RDI[1],in_RDI[6]);
  auVar8 = vpsubsw_avx2(in_RDI[1],in_RDI[6]);
  auVar4 = vpaddsw_avx2(in_RDI[2],in_RDI[5]);
  auVar9 = vpsubsw_avx2(in_RDI[2],in_RDI[5]);
  auVar5 = vpaddsw_avx2(in_RDI[3],in_RDI[4]);
  auVar10 = vpsubsw_avx2(in_RDI[3],in_RDI[4]);
  auVar6 = vpaddsw_avx2(auVar2,auVar5);
  local_800 = auVar6._0_8_;
  in1 = auVar6._8_8_;
  in0 = auVar6._16_8_;
  uVar16 = auVar6._24_8_;
  auVar5 = vpsubsw_avx2(auVar2,auVar5);
  auVar2 = vpaddsw_avx2(auVar3,auVar4);
  uVar18 = auVar2._0_8_;
  uVar20 = auVar2._8_8_;
  lVar22 = auVar2._16_8_;
  uVar24 = auVar2._24_8_;
  auVar2 = vpsubsw_avx2(auVar3,auVar4);
  uVar26 = auVar2._0_8_;
  uVar28 = auVar2._8_8_;
  lVar30 = auVar2._16_8_;
  uStack_7a8 = auVar2._24_8_;
  w0[1] = uVar26;
  w0[0] = uVar24;
  w0[2] = uVar28;
  w0[3] = lVar30;
  w1[1] = uVar18;
  w1[0] = uVar16;
  w1[2] = uVar20;
  w1[3] = lVar22;
  _r[1] = in_stack_fffffffffffff7e0;
  _r[0] = in_stack_fffffffffffff7d8;
  _r[2] = in_stack_fffffffffffff7e8;
  _r[3] = in_stack_fffffffffffff7f0;
  btf_16_w16_avx2(w0,w1,in0,in1,_r,in_stack_fffffffffffff7d4);
  w0_00[1] = uVar26;
  w0_00[0] = uVar24;
  w0_00[2] = uVar28;
  w0_00[3] = lVar30;
  w1_00[1] = uVar18;
  w1_00[0] = uVar16;
  w1_00[2] = uVar20;
  w1_00[3] = lVar22;
  _r_00[1] = in_stack_fffffffffffff7e0;
  _r_00[0] = in_stack_fffffffffffff7d8;
  _r_00[2] = in_stack_fffffffffffff7e8;
  _r_00[3] = in_stack_fffffffffffff7f0;
  btf_16_w16_avx2(w0_00,w1_00,in0,in1,_r_00,in_stack_fffffffffffff7d4);
  w0_01[1] = uVar26;
  w0_01[0] = uVar24;
  w0_01[2] = uVar28;
  w0_01[3] = lVar30;
  w1_01[1] = uVar18;
  w1_01[0] = uVar16;
  w1_01[2] = uVar20;
  w1_01[3] = lVar22;
  _r_01[1] = in_stack_fffffffffffff7e0;
  _r_01[0] = in_stack_fffffffffffff7d8;
  _r_01[2] = in_stack_fffffffffffff7e8;
  _r_01[3] = in_stack_fffffffffffff7f0;
  in1_00 = in1;
  in0_00 = in0;
  uVar17 = uVar16;
  uVar19 = uVar18;
  uVar21 = uVar20;
  lVar23 = lVar22;
  uVar25 = uVar24;
  btf_16_w16_avx2(w0_01,w1_01,in0,in1,_r_01,in_stack_fffffffffffff7d4);
  local_7a0 = auVar5._0_8_;
  uStack_798 = auVar5._8_8_;
  uStack_790 = auVar5._16_8_;
  uStack_788 = auVar5._24_8_;
  auVar2 = vpaddsw_avx2(auVar10,auVar9);
  auVar4 = vpsubsw_avx2(auVar10,auVar9);
  auVar3 = vpsubsw_avx2(auVar7,auVar8);
  local_840 = auVar3._0_8_;
  uStack_838 = auVar3._8_8_;
  uStack_830 = auVar3._16_4_;
  cos_bit_00 = auVar3._20_4_;
  uVar12 = auVar3._24_8_;
  auVar3 = vpaddsw_avx2(auVar7,auVar8);
  uVar13 = auVar3._0_8_;
  uVar14 = auVar3._8_8_;
  lVar15 = auVar3._16_8_;
  uStack_808 = auVar3._24_8_;
  w0_02[1] = uVar26;
  w0_02[0] = uVar25;
  w0_02[2] = uVar28;
  w0_02[3] = lVar30;
  w1_02[1] = uVar19;
  w1_02[0] = uVar17;
  w1_02[2] = uVar21;
  w1_02[3] = lVar23;
  _r_02[1] = uVar13;
  _r_02[0] = uVar12;
  _r_02[2] = uVar14;
  _r_02[3] = lVar15;
  uVar27 = uVar26;
  uVar29 = uVar28;
  lVar31 = lVar30;
  btf_16_w16_avx2(w0_02,w1_02,in0_00,in1_00,_r_02,cos_bit_00);
  local_880 = auVar2._0_8_;
  uStack_878 = auVar2._8_8_;
  uStack_870 = auVar2._16_8_;
  uStack_868 = auVar2._24_8_;
  w0_03[1] = uVar27;
  w0_03[0] = uVar25;
  w0_03[2] = uVar29;
  w0_03[3] = lVar31;
  w1_03[1] = uVar19;
  w1_03[0] = uVar17;
  w1_03[2] = uVar21;
  w1_03[3] = lVar23;
  _r_03[1] = uVar13;
  _r_03[0] = uVar12;
  _r_03[2] = uVar14;
  _r_03[3] = lVar15;
  btf_16_w16_avx2(w0_03,w1_03,in0_00,in1_00,_r_03,cos_bit_00);
  local_860 = auVar4._0_8_;
  uStack_858 = auVar4._8_8_;
  uStack_850 = auVar4._16_8_;
  uStack_848 = auVar4._24_8_;
  *in_RSI = local_800;
  in_RSI[1] = in1;
  in_RSI[2] = in0;
  in_RSI[3] = uVar16;
  in_RSI[4] = local_880;
  in_RSI[5] = uStack_878;
  in_RSI[6] = uStack_870;
  in_RSI[7] = uStack_868;
  in_RSI[8] = uVar26;
  in_RSI[9] = uVar28;
  in_RSI[10] = lVar30;
  in_RSI[0xb] = uStack_7a8;
  in_RSI[0xc] = local_840;
  in_RSI[0xd] = uStack_838;
  in_RSI[0xe] = CONCAT44(cos_bit_00,uStack_830);
  in_RSI[0xf] = uVar12;
  in_RSI[0x10] = uVar18;
  in_RSI[0x11] = uVar20;
  in_RSI[0x12] = lVar22;
  in_RSI[0x13] = uVar24;
  in_RSI[0x14] = local_860;
  in_RSI[0x15] = uStack_858;
  in_RSI[0x16] = uStack_850;
  in_RSI[0x17] = uStack_848;
  in_RSI[0x18] = local_7a0;
  in_RSI[0x19] = uStack_798;
  in_RSI[0x1a] = uStack_790;
  in_RSI[0x1b] = uStack_788;
  in_RSI[0x1c] = uVar13;
  in_RSI[0x1d] = uVar14;
  in_RSI[0x1e] = lVar15;
  in_RSI[0x1f] = uStack_808;
  return;
}

Assistant:

static inline void fdct8x8_new_avx2(const __m256i *input, __m256i *output,
                                    int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);

  // stage 1
  __m256i x1[8];
  x1[0] = _mm256_adds_epi16(input[0], input[7]);
  x1[7] = _mm256_subs_epi16(input[0], input[7]);
  x1[1] = _mm256_adds_epi16(input[1], input[6]);
  x1[6] = _mm256_subs_epi16(input[1], input[6]);
  x1[2] = _mm256_adds_epi16(input[2], input[5]);
  x1[5] = _mm256_subs_epi16(input[2], input[5]);
  x1[3] = _mm256_adds_epi16(input[3], input[4]);
  x1[4] = _mm256_subs_epi16(input[3], input[4]);

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_adds_epi16(x1[0], x1[3]);
  x2[3] = _mm256_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm256_adds_epi16(x1[1], x1[2]);
  x2[2] = _mm256_subs_epi16(x1[1], x1[2]);
  x2[4] = x1[4];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], __rounding,
                  cos_bit);
  x2[5] = x1[5];
  x2[6] = x1[6];
  x2[7] = x1[7];

  // stage 3
  __m256i x3[8];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x2[0], &x2[1], __rounding,
                  cos_bit);
  x3[0] = x2[0];
  x3[1] = x2[1];
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x2[2], &x2[3], __rounding,
                  cos_bit);
  x3[2] = x2[2];
  x3[3] = x2[3];
  x3[4] = _mm256_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm256_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm256_subs_epi16(x2[7], x2[6]);
  x3[7] = _mm256_adds_epi16(x2[7], x2[6]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x3[4], &x3[7], __rounding,
                  cos_bit);
  x4[4] = x3[4];
  x4[7] = x3[7];
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x3[5], &x3[6], __rounding,
                  cos_bit);
  x4[5] = x3[5];
  x4[6] = x3[6];
  // stage 5
  output[0] = x4[0];
  output[1] = x4[4];
  output[2] = x4[2];
  output[3] = x4[6];
  output[4] = x4[1];
  output[5] = x4[5];
  output[6] = x4[3];
  output[7] = x4[7];
}